

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O3

void Buffer_add_reference_Test::TestBody::anon_class_1_0_00000001::__invoke
               (void *data,size_t len,void *vdata)

{
  *(void **)vdata = data;
  *(size_t *)((long)vdata + 8) = len;
  return;
}

Assistant:

TEST(Buffer, add_reference) {
    auto cb = [](void* data, size_t len, void* vdata) {
        auto* iop = reinterpret_cast<bfy_iovec*>(vdata);
        iop->iov_base = data;
        iop->iov_len = len;
    };

    // setup: add the reference to the buffer
    auto buf = bfy_buffer_init();
    auto constexpr str_in = std::string_view { "Lorem ipsum dolor sit amet" };
    auto io = bfy_iovec {};
    EXPECT_EQ(0, bfy_buffer_add_reference(&buf, std::data(str_in), std::size(str_in), cb, &io));

    // destroy the buffer
    bfy_buffer_destruct(&buf);

    // confirm that the callback was invoked
    EXPECT_EQ(std::data(str_in), io.iov_base);
    EXPECT_EQ(std::size(str_in), io.iov_len);
}